

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O3

bool __thiscall input_mod::open2(input_mod *this,long pos)

{
  DUH_SIGRENDERER *sigrenderer;
  DUMB_IT_SIGRENDERER *sigrenderer_00;
  
  if (this->start_order == 0) {
    sigrenderer = duh_start_sigrenderer(this->duh,0,2,(int32)pos);
    this->sr = sigrenderer;
  }
  else {
    sigrenderer = dumb_it_start_at_order(this->duh,2,this->start_order);
    this->sr = sigrenderer;
    if (pos != 0 && sigrenderer != (DUH_SIGRENDERER *)0x0) {
      duh_sigrenderer_generate_samples(sigrenderer,0.0,1.0,(int32)pos,(sample_t_conflict **)0x0);
      sigrenderer = this->sr;
    }
  }
  if (sigrenderer != (DUH_SIGRENDERER *)0x0) {
    sigrenderer_00 = duh_get_it_sigrenderer(sigrenderer);
    dumb_it_set_resampling_quality(sigrenderer_00,this->interp);
    dumb_it_set_ramp_style(sigrenderer_00,this->volramp);
    if ((this->super_StreamSong).super_MusInfo.m_Looping == false) {
      dumb_it_set_loop_callback(sigrenderer_00,dumb_it_callback_terminate,(void *)0x0);
    }
    dumb_it_set_xm_speed_zero_callback(sigrenderer_00,dumb_it_callback_terminate,(void *)0x0);
    dumb_it_set_global_volume_zero_callback(sigrenderer_00,dumb_it_callback_terminate,(void *)0x0);
  }
  return sigrenderer != (DUH_SIGRENDERER *)0x0;
}

Assistant:

bool input_mod::open2(long pos)
{
	if (start_order != 0)
	{
		sr = dumb_it_start_at_order(duh, 2, start_order);
		if (sr && pos) duh_sigrenderer_generate_samples(sr, 0, 1, pos, 0);
	}
	else
	{
		sr = duh_start_sigrenderer(duh, 0, 2, pos);
	}
	if (!sr)
	{
		return false;
	}

	DUMB_IT_SIGRENDERER *itsr = duh_get_it_sigrenderer(sr);
	dumb_it_set_resampling_quality(itsr, interp);
	dumb_it_set_ramp_style(itsr, volramp);
	if (!m_Looping)
	{
		dumb_it_set_loop_callback(itsr, &dumb_it_callback_terminate, NULL);
	}
	dumb_it_set_xm_speed_zero_callback(itsr, &dumb_it_callback_terminate, NULL);
	dumb_it_set_global_volume_zero_callback(itsr, &dumb_it_callback_terminate, NULL);
	return true;
}